

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O0

int signo2(int A,int B)

{
  undefined4 local_14;
  int i;
  int B_local;
  int A_local;
  
  i = A >> 1;
  for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
    i = i >> 1 ^ i;
  }
  return (((((i & B) - ((i & B) >> 1 & 0x77777777U)) - ((i & B) >> 2 & 0x33333333U)) -
          ((i & B) >> 3 & 0x11111111U)) +
          ((int)((((i & B) - ((i & B) >> 1 & 0x77777777U)) - ((i & B) >> 2 & 0x33333333U)) -
                ((i & B) >> 3 & 0x11111111U)) >> 4) & 0xf0f0f0f) % 0xff & 1;
}

Assistant:

int signo2(int A,int B)
{
	//int sig=1;
	//int tA2=((A>>tp)&(B>>tp));
	A>>=1;
	//B&=0xF;
	for(register int i=0;i<3;i++)
		A^=A>>1;
	return bits((A&B))&1;
}